

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O0

stref idx2::GetExtension(stref *Path)

{
  stref sVar1;
  int iStack_d0;
  undefined4 uStack_c0;
  undefined4 local_b0;
  char local_a1;
  str local_a0;
  undefined8 local_98;
  str local_90;
  undefined8 local_88;
  char *local_80;
  cstr LastDot;
  stref *Path_local;
  int local_68;
  str local_58;
  int local_50;
  long local_48;
  undefined4 local_40;
  str local_38;
  undefined4 local_30;
  undefined8 local_28;
  undefined4 local_20;
  undefined8 local_18;
  int local_10;
  
  local_90 = (Path->field_0).Ptr;
  local_88 = *(undefined8 *)&Path->Size;
  local_50 = (int)local_88;
  local_a0 = (Path->field_0).Ptr;
  local_98 = *(undefined8 *)&Path->Size;
  local_30 = (undefined4)local_98;
  local_a1 = '.';
  LastDot = (cstr)Path;
  local_58 = local_90;
  local_38 = local_a0;
  local_80 = FindLast<char*,char>(local_90 + (long)(int)local_88 + -1,local_a0 + -1,&local_a1);
  local_48 = *(long *)LastDot;
  local_b0 = (undefined4)*(undefined8 *)(LastDot + 8);
  local_40 = local_b0;
  if (local_80 == (char *)(local_48 + -1)) {
    Path_local = (stref *)0x0;
    local_68 = 0;
  }
  else {
    local_28 = *(undefined8 *)LastDot;
    uStack_c0 = (undefined4)*(undefined8 *)(LastDot + 8);
    local_20 = uStack_c0;
    local_18 = *(undefined8 *)LastDot;
    iStack_d0 = (int)*(undefined8 *)(LastDot + 8);
    local_10 = iStack_d0;
    sVar1 = SubString((stref *)LastDot,((uint)local_80 - (int)local_28) + 1,
                      ~(uint)local_80 + (int)local_18 + iStack_d0);
    Path_local = (stref *)sVar1.field_0;
    local_68 = sVar1.Size;
  }
  sVar1.Size = local_68;
  sVar1.field_0.Ptr = (str)Path_local;
  sVar1._12_4_ = 0;
  return sVar1;
}

Assistant:

stref
GetExtension(const stref& Path)
{
  cstr LastDot = FindLast(RevBegin(Path), RevEnd(Path), '.');
  if (LastDot == RevEnd(Path))
    return stref();

  return SubString(Path, int(LastDot + 1 - Begin(Path)), int(End(Path) - 1 - LastDot));
}